

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

void jessilib::serialize_object
               (ostream *in_stream,object *in_object,string *in_format,text_encoding in_encoding)

{
  long *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  get_parser((jessilib *)&local_30,in_format);
  (**(code **)(*local_30 + 0x20))(local_30,in_stream,in_object,in_encoding);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

void serialize_object(std::ostream& in_stream, const object& in_object, const std::string& in_format, text_encoding in_encoding) {
	in_object.get<object::string_view_type>(object::string_view_type{});

	get_parser(in_format)->serialize_bytes(in_stream, in_object, in_encoding);
}